

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall
roaring::Roaring64Map::removeRangeClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  iterator iter;
  ulong in_RDX;
  ulong in_RSI;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_RDI;
  Roaring *end_inner;
  _Self temp;
  Roaring *start_inner;
  iterator end_iter;
  iterator start_iter;
  uint32_t uint32_max;
  uint32_t end_low;
  uint32_t end_high;
  uint32_t start_low;
  uint32_t start_high;
  uint in_stack_ffffffffffffff48;
  uint32_t max_00;
  uint32_t in_stack_ffffffffffffff4c;
  uint32_t in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar5;
  const_iterator in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  Roaring64Map *this_00;
  iterator in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_80;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  Roaring *local_58;
  _Self local_50;
  _Self local_48 [2];
  _Base_ptr local_38;
  undefined4 local_2c;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t local_1c;
  ulong local_18;
  uint64_t local_10;
  
  if (in_RSI <= in_RDX) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_1c = highBytes(in_RSI);
    local_20 = lowBytes(local_10);
    local_24 = highBytes(local_18);
    local_28 = lowBytes(local_18);
    local_2c = 0xffffffff;
    bVar1 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::empty((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                     *)0x10a768);
    iVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff54);
    if (!bVar1) {
      in_stack_ffffffffffffff50 = local_24;
      local_38 = (_Base_ptr)
                 std::
                 map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                           *)0x10a79f);
      iVar5 = CONCAT13(1,(int3)iVar5);
      if (ppVar2->first <= in_stack_ffffffffffffff50) {
        in_stack_ffffffffffffff4c = local_1c;
        std::
        map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
        ::crbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                   *)CONCAT44(local_1c,in_stack_ffffffffffffff48));
        ppVar3 = std::
                 reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                               *)CONCAT44(iVar5,in_stack_ffffffffffffff50));
        iVar5 = CONCAT13(ppVar3->first < in_stack_ffffffffffffff4c,(int3)iVar5);
      }
    }
    if ((char)((uint)iVar5 >> 0x18) == '\0') {
      local_48[0]._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::lower_bound((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (key_type *)0x10a805);
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::lower_bound((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (key_type *)0x10a81c);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x10a82b);
      if (ppVar4->first == local_1c) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x10a844);
        local_58 = &ppVar4->second;
        bVar1 = std::operator==(local_48,&local_50);
        if (bVar1) {
          Roaring::removeRangeClosed
                    ((Roaring *)CONCAT44(iVar5,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48);
          local_60 = local_48[0]._M_node;
          eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff68._M_node,in_stack_ffffffffffffff70);
          return;
        }
        Roaring::removeRangeClosed
                  ((Roaring *)CONCAT44(iVar5,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                   in_stack_ffffffffffffff48);
        local_70 = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                   operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                              )in_RDI,iVar5);
        local_68 = local_70;
        eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff68._M_node,in_stack_ffffffffffffff70);
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
      _Rb_tree_const_iterator(&local_78,local_48);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
      _Rb_tree_const_iterator(&local_80,&local_50);
      std::
      map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::erase(in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      iter = std::
             map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             ::end((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      bVar1 = std::operator!=(&local_50,(_Self *)&stack0xffffffffffffff70);
      max_00 = in_stack_ffffffffffffff48 & 0xffffff;
      if (bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x10a946);
        max_00 = CONCAT13(ppVar4->first == local_24,(int3)max_00);
      }
      if ((char)(max_00 >> 0x18) != '\0') {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x10a96a);
        this_00 = (Roaring64Map *)&ppVar4->second;
        Roaring::removeRangeClosed
                  ((Roaring *)CONCAT44(iVar5,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                   max_00);
        eraseIfEmpty(this_00,iter);
      }
    }
  }
  return;
}

Assistant:

void removeRangeClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // If the outer map is empty, end_high is less than the first key,
        // or start_high is greater than the last key, then exit now because
        // there is no work to do.
        if (roarings.empty() || end_high < roarings.cbegin()->first ||
            start_high > (roarings.crbegin())->first) {
            return;
        }

        // If we get here, start_iter points to the first entry in the outer map
        // with key >= start_high. Such an entry is known to exist (i.e. the
        // iterator will not be equal to end()) because start_high <= the last
        // key in the map (thanks to the above if statement).
        auto start_iter = roarings.lower_bound(start_high);
        // end_iter points to the first entry in the outer map with
        // key >= end_high, if such a key exists. Otherwise, it equals end().
        auto end_iter = roarings.lower_bound(end_high);

        // Note that the 'lower_bound' method will find the start and end slots,
        // if they exist; otherwise it will find the next-higher slots.
        // In the case where 'start' landed on an existing slot, we need to do a
        // partial erase of that slot, and likewise for 'end'. But all the slots
        // in between can be fully erased. More precisely:
        //
        // 1. If the start point falls on an existing entry, there are two
        //    subcases:
        //    a. if the end point falls on that same entry, remove the closed
        //       interval [start_low, end_low] from that entry and we are done.
        //    b. Otherwise, remove the closed interval [start_low, uint32_max]
        //       from that entry, advance start_iter, and fall through to
        //       step 2.
        // 2. Completely erase all slots in the half-open interval
        //    [start_iter, end_iter)
        // 3. If the end point falls on an existing entry, remove the closed
        //    interval [0, end_high] from it.

        // Step 1. If the start point falls on an existing entry...
        if (start_iter->first == start_high) {
            auto &start_inner = start_iter->second;
            // 1a. if the end point falls on that same entry...
            if (start_iter == end_iter) {
                start_inner.removeRangeClosed(start_low, end_low);
                eraseIfEmpty(start_iter);
                return;
            }

            // 1b. Otherwise, remove the closed range [start_low, uint32_max]...
            start_inner.removeRangeClosed(start_low, uint32_max);
            // Advance start_iter, but keep the old value so we can check the
            // bitmap we just modified for emptiness and erase if it necessary.
            auto temp = start_iter++;
            eraseIfEmpty(temp);
        }

        // 2. Completely erase all slots in the half-open interval...
        roarings.erase(start_iter, end_iter);

        // 3. If the end point falls on an existing entry...
        if (end_iter != roarings.end() && end_iter->first == end_high) {
            auto &end_inner = end_iter->second;
            end_inner.removeRangeClosed(0, end_low);
            eraseIfEmpty(end_iter);
        }
    }